

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O1

void __thiscall
optTyped_otherTypeCopyConstructionForEmpty_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>::
~optTyped_otherTypeCopyConstructionForEmpty_Test
          (optTyped_otherTypeCopyConstructionForEmpty_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TYPED_TEST(optTyped, otherTypeCopyConstructionForEmpty)
{
  using opt_type = typename TestFixture::type;
  using other_opt_type = opt<typename TestFixture::traits::other_type, typename TestFixture::traits::other_policy_type>;
  other_opt_type o1;
  opt_type o2{o1};
  EXPECT_FALSE(o1);
  EXPECT_FALSE(o1.has_value());
  EXPECT_THROW(o1.value(), bad_optional_access);
  EXPECT_EQ(this->value_2, o1.value_or(this->other_value_2));
  EXPECT_FALSE(o2);
  EXPECT_FALSE(o2.has_value());
  EXPECT_THROW(o2.value(), bad_optional_access);
  EXPECT_EQ(this->value_2, o2.value_or(this->value_2));
}